

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Trap> * __thiscall
wabt::interp::RefPtr<wabt::interp::Object>::As<wabt::interp::Trap>
          (RefPtr<wabt::interp::Trap> *__return_storage_ptr__,RefPtr<wabt::interp::Object> *this)

{
  Store *this_00;
  Object *pOVar1;
  Index IVar2;
  
  this_00 = this->store_;
  pOVar1 = (this_00->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start
           [(((Trap *)this->obj_)->super_Object).self_.index];
  if ((((ulong)pOVar1 & 1) == 0) && (pOVar1->kind_ == Trap)) {
    __return_storage_ptr__->obj_ = (Trap *)this->obj_;
    __return_storage_ptr__->store_ = this_00;
    IVar2 = Store::CopyRoot(this_00,this->root_index_);
    __return_storage_ptr__->root_index_ = IVar2;
    return __return_storage_ptr__;
  }
  __assert_fail("store_->Is<U>(obj_->self())",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0x15b,
                "RefPtr<U> wabt::interp::RefPtr<wabt::interp::Object>::As() [T = wabt::interp::Object, U = wabt::interp::Trap]"
               );
}

Assistant:

RefPtr<U> RefPtr<T>::As() {
  static_assert(std::is_base_of<T, U>::value, "T must be base class of U");
  assert(store_->Is<U>(obj_->self()));
  RefPtr<U> result;
  result.obj_ = static_cast<U*>(obj_);
  result.store_ = store_;
  result.root_index_ = store_->CopyRoot(root_index_);
  return result;
}